

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

void __thiscall
axl::sl::StringBase<short,_axl::sl::StringDetailsBase<short>_>::clear
          (StringBase<short,_axl::sl::StringDetailsBase<short>_> *this)

{
  BufHdr *pBVar1;
  
  pBVar1 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    if ((pBVar1->super_RefCount).m_refCount != 1) {
      pBVar1 = (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_hdr;
      if (pBVar1 != (BufHdr *)0x0) {
        rc::RefCount::release(&pBVar1->super_RefCount);
      }
      *(undefined8 *)
       ((long)&(this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_hdr + 1) = 0
      ;
      *(undefined8 *)
       ((long)&(this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length + 1)
           = 0;
      (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_p = (C *)0x0;
      (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_hdr = (BufHdr *)0x0;
      return;
    }
    (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_p = (C *)(pBVar1 + 1);
    *(undefined2 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
    (this->super_StringRefBase<short,_axl::sl::StringDetailsBase<short>_>).m_length = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_hdr) {
			ASSERT(!this->m_length);
			return;
		}

		if (this->m_hdr->getRefCount() != 1) {
			this->release();
			return;
		}

		this->m_p = (C*)(this->m_hdr + 1);
		this->m_p[0] = 0;
		this->m_length = 0;
	}